

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

string * deqp::gles3::Performance::anon_unknown_1::FunctionCase::incrementExpr
                   (string *__return_storage_ptr__,string *baseExpr,DataType type,bool divide)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined7 in_register_00000009;
  long *plVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  string mulOrDiv;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48 [2];
  long local_38 [2];
  
  pcVar8 = "*";
  bVar10 = (int)CONCAT71(in_register_00000009,divide) != 0;
  if (bVar10) {
    pcVar8 = "/";
  }
  pcVar7 = "";
  if (bVar10) {
    pcVar7 = "";
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar8,pcVar7);
  if (type - TYPE_BOOL < 4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (baseExpr->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + baseExpr->_M_string_length);
    bVar10 = false;
    bVar9 = false;
  }
  else {
    bVar10 = type - TYPE_INT < 4;
    if (bVar10) {
      std::operator+(&local_68,"(",baseExpr);
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48[0]);
      local_88 = &local_78;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_78 = *plVar6;
        lStack_70 = plVar4[3];
      }
      else {
        local_78 = *plVar6;
        local_88 = (long *)*plVar4;
      }
      local_80 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
    }
    else {
      std::operator+(&local_68,"(",baseExpr);
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48[0]);
      local_88 = &local_78;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_78 = *plVar4;
        lStack_70 = puVar5[3];
      }
      else {
        local_78 = *plVar4;
        local_88 = (long *)*puVar5;
      }
      local_80 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar1 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar1) {
      uVar3 = puVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    }
    __return_storage_ptr__->_M_string_length = puVar5[1];
    *puVar5 = psVar1;
    bVar9 = 3 < type - TYPE_INT;
    puVar5[1] = 0;
    *(undefined1 *)psVar1 = 0;
  }
  if (bVar9) {
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar10) {
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string FunctionCase::incrementExpr (const string& baseExpr, glu::DataType type, bool divide)
{
	const string mulOrDiv = divide ? "/" : "*";

	return glu::isDataTypeBoolOrBVec(type)	? baseExpr
		 : glu::isDataTypeIntOrIVec(type)	? "(" + baseExpr + mulOrDiv + "(i+1))"
		 :									  "(" + baseExpr + mulOrDiv + "float(i+1))";
}